

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O3

CellRelation __thiscall S2ShapeIndex::Iterator::Locate(Iterator *this,S2CellId target)

{
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var1;
  S2CellId SVar2;
  char cVar3;
  ulong uVar4;
  
  uVar4 = ~target.id_ & target.id_ - 1;
  _Var1._M_head_impl =
       (this->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x30))
            (_Var1._M_head_impl,target.id_ - uVar4);
  _Var1._M_head_impl =
       (this->iter_)._M_t.
       super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
       .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
  SVar2.id_ = ((_Var1._M_head_impl)->id_).id_;
  if (SVar2.id_ != 0xffffffffffffffff) {
    if ((target.id_ <= SVar2.id_) && (SVar2.id_ - (~SVar2.id_ & SVar2.id_ - 1) <= target.id_)) {
      return INDEXED;
    }
    if (SVar2.id_ <= uVar4 + target.id_) {
      return SUBDIVIDED;
    }
  }
  cVar3 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x28))();
  if ((cVar3 != '\0') &&
     (SVar2.id_ = (((this->iter_)._M_t.
                    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                  id_, target.id_ <= (SVar2.id_ - 1 | SVar2.id_))) {
    return INDEXED;
  }
  return DISJOINT;
}

Assistant:

CellRelation Locate(S2CellId target) {
      return IteratorBase::LocateImpl(target, this);
    }